

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

int __thiscall PeleLM::init(PeleLM *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FabArrayBase *this_00;
  FabArrayBase *this_01;
  MultiArray4<double> *nFctCma;
  MultiArray4<const_double> *oFctCma;
  MultiArray4<double> *nrYdotma;
  MultiArray4<const_double> *orYdotma;
  MultiFab *FuncCount_old;
  FillPatchIterator FctCntfpi;
  MultiFab *Ydot_old;
  FillPatchIterator Ydotfpi;
  MultiFab *FuncCount;
  MultiFab *Ydot;
  Real tnp1;
  PeleLM *oldht;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 uVar1;
  int in_stack_fffffffffffffaec;
  AmrLevel *in_stack_fffffffffffffaf0;
  EVP_PKEY_CTX *mf;
  StateData *in_stack_fffffffffffffb10;
  FillPatchIterator *this_02;
  undefined8 in_stack_fffffffffffffb18;
  int boxGrow;
  MultiFab *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  int direction;
  FillPatchIterator *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb40;
  Array4<double> *local_4b0;
  Array4<double> **local_4a8;
  Array4<const_double> *local_4a0;
  Array4<const_double> **local_498;
  Array4<double> *local_490;
  Array4<double> **local_488;
  Array4<const_double> *local_480;
  Array4<const_double> **local_478;
  MultiFab *local_470;
  FillPatchIterator local_458;
  MultiFab *local_248;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  AmrLevel *in_stack_fffffffffffffe20;
  
  boxGrow = (int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  NavierStokesBase::init(&this->super_NavierStokesBase,ctx);
  direction = 0;
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffaf0,CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
            );
  amrex::StateData::curTime(in_stack_fffffffffffffb10);
  this_00 = (FabArrayBase *)
            amrex::AmrLevel::get_new_data(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
  this_01 = (FabArrayBase *)
            amrex::AmrLevel::get_new_data(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
  amrex::AmrLevel::get_new_data(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
  RhoH_to_Temp((MultiFab *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
               in_stack_fffffffffffffe18);
  mf = ctx;
  amrex::FabArrayBase::nGrow(this_00,direction);
  this_02 = (FillPatchIterator *)&stack0xfffffffffffffdc0;
  amrex::FillPatchIterator::FillPatchIterator
            (in_stack_fffffffffffffb30,(AmrLevel *)CONCAT44(direction,in_stack_fffffffffffffb28),
             in_stack_fffffffffffffb20,boxGrow,(Real)this_02,(int)((ulong)this_00 >> 0x20),
             (int)this_00,in_stack_fffffffffffffb40);
  local_248 = amrex::FillPatchIterator::get_mf(this_02);
  amrex::FabArrayBase::nGrow(this_01,direction);
  uVar1 = 1;
  amrex::FillPatchIterator::FillPatchIterator
            (in_stack_fffffffffffffb30,(AmrLevel *)CONCAT44(direction,in_stack_fffffffffffffb28),
             (MultiFab *)this_01,(int)((ulong)ctx >> 0x20),(Real)this_02,
             (int)((ulong)this_00 >> 0x20),(int)this_00,in_stack_fffffffffffffb40);
  local_470 = amrex::FillPatchIterator::get_mf(&local_458);
  local_480 = (Array4<const_double> *)
              amrex::FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffaec,uVar1));
  local_478 = &local_480;
  local_490 = (Array4<double> *)
              amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffaec,uVar1));
  local_488 = &local_490;
  local_4a0 = (Array4<const_double> *)
              amrex::FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffaec,uVar1));
  local_498 = &local_4a0;
  local_4b0 = (Array4<double> *)
              amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffffaec,uVar1));
  local_4a8 = &local_4b0;
  amrex::experimental::ParallelFor<amrex::MultiFab,PeleLM::init(amrex::AmrLevel&)::__0>
            ((MultiFab *)mf,(anon_class_32_4_e9619941 *)this);
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_fffffffffffffaf0);
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_fffffffffffffaf0);
  return extraout_EAX;
}

Assistant:

void
PeleLM::init (AmrLevel& old)
{
   NavierStokesBase::init(old);

   PeleLM* oldht    = (PeleLM*) &old;
   const Real    tnp1 = oldht->state[State_Type].curTime();

   //
   // Get good version of rhoYdot and Function count
   //
   MultiFab& Ydot = get_new_data(RhoYdot_Type);
   MultiFab& FuncCount = get_new_data(FuncCount_Type);
   RhoH_to_Temp(get_new_data(State_Type));

   FillPatchIterator Ydotfpi(*oldht,Ydot,Ydot.nGrow(),tnp1,RhoYdot_Type,0,NUM_SPECIES);
   const MultiFab& Ydot_old = Ydotfpi.get_mf();

   FillPatchIterator FctCntfpi(*oldht,FuncCount,FuncCount.nGrow(),tnp1,FuncCount_Type,0,1);
   const MultiFab& FuncCount_old = FctCntfpi.get_mf();

   auto const& orYdotma = Ydot_old.const_arrays();
   auto const& nrYdotma = Ydot.arrays();
   auto const& oFctCma  = FuncCount_old.const_arrays();
   auto const& nFctCma  = FuncCount.arrays();
   amrex::ParallelFor(Ydot_old,
   [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
   {
      nFctCma[box_no](i,j,k) = oFctCma[box_no](i,j,k);
      for (int n = 0; n < NUM_SPECIES; n++) {
         nrYdotma[box_no](i,j,k,n) = orYdotma[box_no](i,j,k,n);
      }
   });
}